

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileConnections.hpp
# Opt level: O0

void helics::fileops::makeConnectionsToml<helics::CoreBroker>(CoreBroker *brk,string *file)

{
  string_view defVal;
  string_view defVal_00;
  string_view defVal_01;
  string_view defVal_02;
  string_view defVal_03;
  string_view defVal_04;
  string_view defVal_05;
  string_view value;
  string_view value_00;
  string_view input;
  string_view target;
  string_view endpoint;
  string_view valueName;
  string_view valueName_00;
  string_view alias;
  string_view alias_00;
  string_view publication;
  string_view source;
  string_view filter;
  string_view interfaceKey;
  string_view interfaceKey_00;
  anon_class_16_2_4418202b callback;
  anon_class_16_2_4418055b callback_00;
  anon_class_16_2_4418055b callback_01;
  anon_class_16_2_4417f657 callback_02;
  anon_class_16_2_4417f657 callback_03;
  anon_class_16_2_4418202b callback_04;
  anon_class_16_2_4418055b callback_05;
  anon_class_16_2_4418055b callback_06;
  anon_class_16_2_4417f657 callback_07;
  anon_class_16_2_4417f657 callback_08;
  anon_class_16_2_d8a696df callback_09;
  anon_class_16_2_d8a696df callback_10;
  anon_class_16_2_d8a696df callback_11;
  anon_class_16_2_d8a696df callback_12;
  anon_class_16_2_d8a696df callback_13;
  bool bVar1;
  basic_value<toml::type_config> *this;
  array_type *paVar2;
  basic_value<toml::type_config> *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>
  *val_3;
  iterator __end4_3;
  iterator __begin4_3;
  table_type *__range4_3;
  basic_value<toml::type_config> *val_2;
  iterator __end4_2;
  iterator __begin4_2;
  array_type *__range4_2;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> aliases;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>
  *val_1;
  iterator __end4_1;
  iterator __begin4_1;
  table_type *__range4_1;
  basic_value<toml::type_config> *val;
  iterator __end4;
  iterator __begin4;
  array_type *__range4;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> globals;
  anon_class_16_2_d8a696df adst;
  anon_class_16_2_d8a696df asrc;
  string fname;
  array_type *filtAct;
  basic_value<toml::type_config> *filt;
  iterator __end3_2;
  iterator __begin3_2;
  array_type *__range3_2;
  array_type *filtArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> filts;
  string ept_1;
  string ipt_1;
  string pub_1;
  array_type *connAct_1;
  basic_value<toml::type_config> *conn_1;
  iterator __end3_1;
  iterator __begin3_1;
  array_type *__range3_1;
  array_type *connArray_1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> lnks;
  string ept;
  string ipt;
  string pub;
  array_type *connAct;
  basic_value<toml::type_config> *conn;
  iterator __end3;
  iterator __begin3;
  array_type *__range3;
  array_type *connArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> conns;
  invalid_argument *ia;
  value doc;
  value uVal;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
  *in_stack_ffffffffffffee18;
  basic_value<toml::type_config> *in_stack_ffffffffffffee20;
  basic_value<toml::type_config> *in_stack_ffffffffffffee30;
  basic_value<toml::type_config> *in_stack_ffffffffffffee38;
  string *in_stack_ffffffffffffee40;
  basic_value<toml::type_config> *in_stack_ffffffffffffee48;
  basic_value<toml::type_config> *in_stack_ffffffffffffee50;
  basic_value<toml::type_config> *in_stack_ffffffffffffee58;
  basic_value<toml::type_config> *in_stack_ffffffffffffee60;
  basic_value<toml::type_config> *in_stack_ffffffffffffee68;
  CoreBroker *in_stack_ffffffffffffef00;
  undefined8 in_stack_ffffffffffffef08;
  CoreBroker *in_stack_ffffffffffffef10;
  string_type *in_stack_ffffffffffffef18;
  basic_value<toml::type_config> *in_stack_ffffffffffffef20;
  string_type *in_stack_ffffffffffffef28;
  array_type *in_stack_ffffffffffffef30;
  reference in_stack_fffffffffffff048;
  value *in_stack_fffffffffffff050;
  CoreBroker *in_stack_fffffffffffff058;
  reference in_stack_fffffffffffff060;
  string *in_stack_fffffffffffff0d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_f10;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_f08;
  table_type *local_f00;
  __sv_type local_ef8;
  __sv_type local_ee8;
  reference local_ed8;
  basic_value<toml::type_config> *local_ed0;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_ec8;
  basic_value<toml::type_config> *local_ec0;
  __sv_type local_df0;
  __sv_type local_de0;
  reference local_dd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_dc8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_dc0;
  table_type *local_db8;
  __sv_type local_db0;
  __sv_type local_da0;
  reference local_d90;
  basic_value<toml::type_config> *local_d88;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_d80;
  array_type *local_d78;
  basic_value<toml::type_config> *local_ca8;
  undefined1 *puStack_ca0;
  allocator<char> local_c89 [33];
  basic_value<toml::type_config> *local_c68;
  undefined1 *puStack_c60;
  allocator<char> local_c49 [33];
  basic_value<toml::type_config> *local_c28;
  undefined1 *puStack_c20;
  basic_value<toml::type_config> *local_c18;
  undefined1 *puStack_c10;
  allocator<char> local_bf9 [33];
  basic_value<toml::type_config> *local_bd8;
  undefined1 *puStack_bd0;
  allocator<char> local_bb9 [33];
  basic_value<toml::type_config> *local_b98;
  undefined1 *puStack_b90;
  allocator<char> local_b81 [33];
  basic_value<toml::type_config> *local_b60;
  undefined1 *puStack_b58;
  undefined1 local_b50 [55];
  undefined1 local_b19 [81];
  __sv_type local_ac8;
  array_type *local_ab8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab0;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_aa0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a90 [13];
  basic_value<toml::type_config> *local_9c0;
  _Elt_pointer local_9b8;
  allocator<char> local_9a9 [33];
  basic_value<toml::type_config> *local_988;
  undefined1 *local_980;
  allocator<char> local_971 [65];
  __sv_type local_930;
  allocator<char> local_919 [33];
  undefined1 local_8f8 [88];
  basic_value<toml::type_config> *local_8a0;
  pointer local_898;
  allocator<char> local_889 [65];
  __sv_type local_848;
  allocator<char> local_831 [33];
  undefined1 local_810 [40];
  pointer local_7e8;
  allocator<char> local_7d9 [65];
  __sv_type local_798;
  allocator<char> local_781 [33];
  undefined1 local_760 [48];
  __sv_type local_730;
  undefined8 local_720;
  reference local_718;
  basic_value<toml::type_config> *local_710;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_708;
  _Elt_pointer local_700;
  _Elt_pointer local_6f8;
  basic_value<toml::type_config> *local_628;
  __node_base_ptr *local_620;
  allocator<char> local_611 [33];
  basic_value<toml::type_config> *local_5f0;
  __node_base_ptr *local_5e8;
  allocator<char> local_5d9 [65];
  __sv_type local_598;
  allocator<char> local_581 [33];
  __node_base_ptr local_560 [4];
  basic_value<toml::type_config> *local_540;
  undefined1 *local_538;
  allocator<char> local_529 [33];
  basic_value<toml::type_config> *local_508;
  undefined1 *local_500;
  undefined1 local_4f1 [65];
  __sv_type local_4b0;
  allocator<char> local_499 [33];
  undefined1 local_478 [32];
  basic_value<toml::type_config> *local_458;
  __node_base local_450;
  allocator<char> local_441 [65];
  __sv_type local_400;
  allocator<char> local_3e9 [33];
  _Hash_node_base local_3c8 [4];
  __sv_type local_3a8;
  __sv_type local_398;
  array_type *local_388;
  reference local_380;
  basic_value<toml::type_config> *local_378;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_370;
  array_type *local_368;
  array_type *local_360;
  basic_value<toml::type_config> *local_8;
  
  local_8 = in_RDI;
  toml::basic_value<toml::type_config>::basic_value(in_stack_ffffffffffffee20);
  toml::basic_value<toml::type_config>::basic_value(in_stack_ffffffffffffee20);
  loadToml(in_stack_fffffffffffff0d8);
  toml::basic_value<toml::type_config>::operator=
            (in_stack_ffffffffffffee38,in_stack_ffffffffffffee30);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  toml::find_or<toml::type_config,char[12]>
            (in_stack_ffffffffffffee68,(char (*) [12])in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x5fea8c)
  ;
  if (!bVar1) {
    local_368 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
    local_360 = local_368;
    local_370._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_ffffffffffffee18);
    local_378 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)in_stack_ffffffffffffee18);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffee20,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffee18), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_380 = __gnu_cxx::
                  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_370);
      bVar1 = toml::basic_value<toml::type_config>::is_array
                        ((basic_value<toml::type_config> *)0x5feb37);
      if (bVar1) {
        local_388 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](local_388,0);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_398 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](local_388,1);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_3a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        publication._M_str = (char *)in_stack_ffffffffffffef30;
        publication._M_len = (size_t)in_stack_ffffffffffffef28;
        input._M_str = (char *)in_stack_ffffffffffffef20;
        input._M_len = (size_t)in_stack_ffffffffffffef18;
        CoreBroker::dataLink(in_stack_ffffffffffffef10,publication,input);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                   (allocator<char> *)in_stack_ffffffffffffee50);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee30);
        local_400 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        defVal._M_str = (char *)in_stack_ffffffffffffee58;
        defVal._M_len = (size_t)in_stack_ffffffffffffee50;
        getOrDefault(in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,defVal);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::allocator<char>::~allocator(local_3e9);
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x5fed36);
        if (bVar1) {
          in_stack_fffffffffffff060 = local_380;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          in_stack_fffffffffffff058 = (CoreBroker *)(local_4f1 + 0x21);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee30);
          local_4b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffee20);
          defVal_00._M_str = (char *)in_stack_ffffffffffffee58;
          defVal_00._M_len = (size_t)in_stack_ffffffffffffee50;
          getOrDefault(in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,defVal_00);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_499);
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x5fef5e);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee30);
            local_598 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffee20);
            defVal_01._M_str = (char *)in_stack_ffffffffffffee58;
            defVal_01._M_len = (size_t)in_stack_ffffffffffffee50;
            getOrDefault(in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,defVal_01);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator(local_581);
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x5ff273);
            if (!bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                         (allocator<char> *)in_stack_ffffffffffffee50);
              local_5f0 = local_8;
              local_5e8 = local_560;
              callback_02.ept = (string *)in_stack_fffffffffffff060;
              callback_02.brk = in_stack_fffffffffffff058;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_4_>
                        (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_02);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee20);
              std::allocator<char>::~allocator(local_5d9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                         (allocator<char> *)in_stack_ffffffffffffee50);
              local_628 = local_8;
              local_620 = local_560;
              callback_03.ept = (string *)in_stack_fffffffffffff060;
              callback_03.brk = in_stack_fffffffffffff058;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_5_>
                        (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_03);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee20);
              std::allocator<char>::~allocator(local_611);
            }
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
          }
          else {
            in_stack_fffffffffffff050 = (value *)local_4f1;
            in_stack_fffffffffffff048 = local_380;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            local_508 = local_8;
            local_500 = local_478;
            callback_00.ipt = (string *)in_stack_fffffffffffff060;
            callback_00.brk = in_stack_fffffffffffff058;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_2_>
                      (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_00);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator((allocator<char> *)local_4f1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            local_540 = local_8;
            local_538 = local_478;
            callback_01.ipt = (string *)in_stack_fffffffffffff060;
            callback_01.brk = in_stack_fffffffffffff058;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_3_>
                      (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_01);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator(local_529);
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          local_458 = local_8;
          local_450._M_nxt = local_3c8;
          callback.pub = (string *)in_stack_fffffffffffff060;
          callback.brk = in_stack_fffffffffffff058;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>
                    (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_441);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
      }
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_370);
    }
  }
  toml::find_or<toml::type_config,char[6]>
            (in_stack_ffffffffffffee68,(char (*) [6])in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x5ff558)
  ;
  if (!bVar1) {
    local_700 = (_Elt_pointer)
                toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
    local_6f8 = local_700;
    local_708._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_ffffffffffffee18);
    local_710 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)in_stack_ffffffffffffee18);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffee20,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffee18), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_718 = __gnu_cxx::
                  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_708);
      bVar1 = toml::basic_value<toml::type_config>::is_array
                        ((basic_value<toml::type_config> *)0x5ff603);
      if (bVar1) {
        local_720 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[]((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                      *)local_720,0);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_730 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[]((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                      *)local_720,1);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_760._32_16_ =
             (undefined1  [16])
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffee20);
        source._M_str = (char *)in_stack_ffffffffffffef30;
        source._M_len = (size_t)in_stack_ffffffffffffef28;
        target._M_str = (char *)in_stack_ffffffffffffef20;
        target._M_len = (size_t)in_stack_ffffffffffffef18;
        CoreBroker::linkEndpoints(in_stack_ffffffffffffef10,source,target);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                   (allocator<char> *)in_stack_ffffffffffffee50);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee30);
        local_798 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        defVal_02._M_str = (char *)in_stack_ffffffffffffee58;
        defVal_02._M_len = (size_t)in_stack_ffffffffffffee50;
        getOrDefault(in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,defVal_02);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::allocator<char>::~allocator(local_781);
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x5ff7e9);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee30);
          local_848 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffee20);
          defVal_03._M_str = (char *)in_stack_ffffffffffffee58;
          defVal_03._M_len = (size_t)in_stack_ffffffffffffee50;
          getOrDefault(in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,defVal_03);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_831);
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x5ffa11);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee30);
            local_930 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffee20);
            defVal_04._M_str = (char *)in_stack_ffffffffffffee58;
            defVal_04._M_len = (size_t)in_stack_ffffffffffffee50;
            getOrDefault(in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,defVal_04);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator(local_919);
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x5ffd26);
            if (!bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                         (allocator<char> *)in_stack_ffffffffffffee50);
              local_988 = local_8;
              local_980 = local_8f8;
              callback_07.ept = (string *)in_stack_fffffffffffff060;
              callback_07.brk = in_stack_fffffffffffff058;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_9_>
                        (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_07);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee20);
              std::allocator<char>::~allocator(local_971);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                         (allocator<char> *)in_stack_ffffffffffffee50);
              local_9c0 = local_8;
              local_9b8 = (_Elt_pointer)local_8f8;
              callback_08.ept = (string *)in_stack_fffffffffffff060;
              callback_08.brk = in_stack_fffffffffffff058;
              addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_10_>
                        (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_08);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee20);
              std::allocator<char>::~allocator(local_9a9);
            }
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            local_8a0 = local_8;
            local_898 = (pointer)local_810;
            callback_05.ipt = (string *)in_stack_fffffffffffff060;
            callback_05.brk = in_stack_fffffffffffff058;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_7_>
                      (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_05);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator(local_889);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                       (allocator<char> *)in_stack_ffffffffffffee50);
            local_8f8._32_8_ = local_8;
            local_8f8._40_8_ = local_810;
            callback_06.ipt = (string *)in_stack_fffffffffffff060;
            callback_06.brk = in_stack_fffffffffffff058;
            addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_8_>
                      (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_06);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee20);
            std::allocator<char>::~allocator((allocator<char> *)(local_8f8 + 0x37));
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          local_810._32_8_ = local_8;
          local_7e8 = (pointer)local_760;
          callback_04.pub = (string *)in_stack_fffffffffffff060;
          callback_04.brk = in_stack_fffffffffffff058;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_6_>
                    (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_04);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_7d9);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
      }
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_708);
    }
  }
  toml::find_or<toml::type_config,char[8]>
            (in_stack_ffffffffffffee68,(char (*) [8])in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x60000b)
  ;
  if (!bVar1) {
    local_aa0[1]._M_current =
         (basic_value<toml::type_config> *)
         toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
    local_a90[0]._0_8_ = local_aa0[1]._M_current;
    local_aa0[0]._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_ffffffffffffee18);
    local_ab0._8_8_ =
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                *)in_stack_ffffffffffffee18);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffee20,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffee18), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_ab0._M_allocated_capacity =
           (size_type)
           __gnu_cxx::
           __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
           ::operator*(local_aa0);
      bVar1 = toml::basic_value<toml::type_config>::is_array
                        ((basic_value<toml::type_config> *)0x6000b6);
      if (bVar1) {
        in_stack_ffffffffffffef30 =
             toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
        in_stack_ffffffffffffef20 = local_8;
        local_ab8 = in_stack_ffffffffffffef30;
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](in_stack_ffffffffffffef30,0);
        in_stack_ffffffffffffef28 =
             toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_ac8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](local_ab8,1);
        in_stack_ffffffffffffef18 =
             toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_b19._65_16_ =
             (undefined1  [16])
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffee20);
        filter._M_str = (char *)in_stack_ffffffffffffef30;
        filter._M_len = (size_t)in_stack_ffffffffffffef28;
        endpoint._M_str = (char *)in_stack_ffffffffffffef20;
        endpoint._M_len = (size_t)in_stack_ffffffffffffef18;
        CoreBroker::addSourceFilterToEndpoint(in_stack_ffffffffffffef10,filter,endpoint);
      }
      else {
        in_stack_ffffffffffffef10 = (CoreBroker *)local_b19;
        in_stack_ffffffffffffef08 = local_ab0._M_allocated_capacity;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                   (allocator<char> *)in_stack_ffffffffffffee50);
        in_stack_ffffffffffffef00 = (CoreBroker *)local_b50;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee30);
        local_b50._32_16_ =
             (undefined1  [16])
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffee20);
        defVal_05._M_str = (char *)in_stack_ffffffffffffee58;
        defVal_05._M_len = (size_t)in_stack_ffffffffffffee50;
        getOrDefault(in_stack_ffffffffffffee48,in_stack_ffffffffffffee40,defVal_05);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        std::allocator<char>::~allocator((allocator<char> *)local_b19);
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x60029c);
        if (!bVar1) {
          local_b60 = local_8;
          puStack_b58 = local_b19 + 0x21;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          local_b98 = local_b60;
          puStack_b90 = puStack_b58;
          callback_09.fname = (string *)in_stack_fffffffffffff060;
          callback_09.brk = in_stack_fffffffffffff058;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_09);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_b81);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          local_bd8 = local_b60;
          puStack_bd0 = puStack_b58;
          callback_10.fname = (string *)in_stack_fffffffffffff060;
          callback_10.brk = in_stack_fffffffffffff058;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_10);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_bb9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          local_c18 = local_b60;
          puStack_c10 = puStack_b58;
          callback_11.fname = (string *)in_stack_fffffffffffff060;
          callback_11.brk = in_stack_fffffffffffff058;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_11);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_bf9);
          local_c28 = local_8;
          puStack_c20 = local_b19 + 0x21;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          local_c68 = local_c28;
          puStack_c60 = puStack_c20;
          callback_12.fname = (string *)in_stack_fffffffffffff060;
          callback_12.brk = in_stack_fffffffffffff058;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                    (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_12);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_c49);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee60,(char *)in_stack_ffffffffffffee58,
                     (allocator<char> *)in_stack_ffffffffffffee50);
          local_ca8 = local_c28;
          puStack_ca0 = puStack_c20;
          callback_13.fname = (string *)in_stack_fffffffffffff060;
          callback_13.brk = in_stack_fffffffffffff058;
          addTargets<helics::fileops::makeConnectionsToml<helics::CoreBroker>(helics::CoreBroker*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                    (in_stack_fffffffffffff050,(string *)in_stack_fffffffffffff048,callback_13);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20);
          std::allocator<char>::~allocator(local_c89);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
      }
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(local_aa0);
    }
  }
  toml::find_or<toml::type_config,char[8]>
            (in_stack_ffffffffffffee68,(char (*) [8])in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x6007fc)
  ;
  if (!bVar1) {
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x600811);
    if (bVar1) {
      local_d78 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
      local_d80._M_current =
           (basic_value<toml::type_config> *)
           std::
           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)in_stack_ffffffffffffee18);
      local_d88 = (basic_value<toml::type_config> *)
                  std::
                  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         *)in_stack_ffffffffffffee18);
      while (bVar1 = __gnu_cxx::
                     operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffee20,
                                (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffee18), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_d90 = __gnu_cxx::
                    __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                    ::operator*(&local_d80);
        paVar2 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar2,0);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_da0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        paVar2 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar2,1);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_db0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        valueName._M_str = (char *)in_stack_ffffffffffffef20;
        valueName._M_len = (size_t)in_stack_ffffffffffffef18;
        value._M_str = (char *)in_stack_ffffffffffffef10;
        value._M_len = in_stack_ffffffffffffef08;
        CoreBroker::setGlobal(in_stack_ffffffffffffef00,valueName,value);
        __gnu_cxx::
        __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator++(&local_d80);
      }
    }
    else {
      local_db8 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_
                            (in_stack_ffffffffffffee60);
      local_dc0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::begin(in_stack_ffffffffffffee18);
      local_dc8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::end(in_stack_ffffffffffffee18);
      while (bVar1 = std::__detail::operator==(&local_dc0,&local_dc8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_dd0 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                                 *)0x600a26);
        in_stack_ffffffffffffee68 = local_8;
        local_de0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        local_df0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        valueName_00._M_str = (char *)in_stack_ffffffffffffef20;
        valueName_00._M_len = (size_t)in_stack_ffffffffffffef18;
        value_00._M_str = (char *)in_stack_ffffffffffffef10;
        value_00._M_len = in_stack_ffffffffffffef08;
        CoreBroker::setGlobal(in_stack_ffffffffffffef00,valueName_00,value_00);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                      *)in_stack_ffffffffffffee20);
      }
    }
  }
  toml::find_or<toml::type_config,char[8]>
            (in_stack_ffffffffffffee68,(char (*) [8])in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x600b09)
  ;
  if (!bVar1) {
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x600b1e);
    if (bVar1) {
      this = (basic_value<toml::type_config> *)
             toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee60);
      local_ec0 = this;
      local_ec8._M_current =
           (basic_value<toml::type_config> *)
           std::
           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)in_stack_ffffffffffffee18);
      local_ed0 = (basic_value<toml::type_config> *)
                  std::
                  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         *)in_stack_ffffffffffffee18);
      while (bVar1 = __gnu_cxx::
                     operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffee20,
                                (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffee18), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_ed8 = __gnu_cxx::
                    __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                    ::operator*(&local_ec8);
        paVar2 = toml::basic_value<toml::type_config>::as_array(this);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar2,0);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(this);
        local_ee8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        paVar2 = toml::basic_value<toml::type_config>::as_array(this);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar2,1);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(this);
        local_ef8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee20);
        interfaceKey._M_str = (char *)in_stack_ffffffffffffef30;
        interfaceKey._M_len = (size_t)in_stack_ffffffffffffef28;
        alias._M_str = (char *)in_stack_ffffffffffffef20;
        alias._M_len = (size_t)in_stack_ffffffffffffef18;
        CoreBroker::addAlias(in_stack_ffffffffffffef10,interfaceKey,alias);
        __gnu_cxx::
        __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator++(&local_ec8);
      }
    }
    else {
      local_f00 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_
                            (in_stack_ffffffffffffee60);
      local_f08._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::begin(in_stack_ffffffffffffee18);
      local_f10._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::end(in_stack_ffffffffffffee18);
      while (bVar1 = std::__detail::operator==(&local_f08,&local_f10), ((bVar1 ^ 0xffU) & 1) != 0) {
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                     *)0x600d2e);
        in_stack_ffffffffffffee20 = local_8;
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee60);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20);
        interfaceKey_00._M_str = (char *)in_stack_ffffffffffffef30;
        interfaceKey_00._M_len = (size_t)in_stack_ffffffffffffef28;
        alias_00._M_str = (char *)in_stack_ffffffffffffef20;
        alias_00._M_len = (size_t)in_stack_ffffffffffffef18;
        CoreBroker::addAlias(in_stack_ffffffffffffef10,interfaceKey_00,alias_00);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                      *)in_stack_ffffffffffffee20);
      }
    }
  }
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffee20);
  return;
}

Assistant:

void makeConnectionsToml(brkX* brk, const std::string& file)
{
    toml::value uVal;
    static_assert(std::is_base_of<Broker, brkX>::value || std::is_base_of<Core, brkX>::value,
                  "broker must be Core or broker");
    toml::value doc;
    try {
        doc = loadToml(file);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }

    auto conns = toml::find_or(doc, "connections", uVal);
    if (!conns.is_empty()) {
        auto& connArray = conns.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->dataLink(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto lnks = toml::find_or(doc, "links", uVal);
    if (!lnks.is_empty()) {
        auto& connArray = lnks.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->linkEndpoints(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto filts = toml::find_or(doc, "filters", uVal);
    if (!filts.is_empty()) {
        auto& filtArray = filts.as_array();
        for (const auto& filt : filtArray) {
            if (filt.is_array()) {
                auto& filtAct = filt.as_array();
                brk->addSourceFilterToEndpoint(filtAct[0].as_string(), filtAct[1].as_string());
            } else {
                std::string fname = getOrDefault(filt, "filter", std::string());
                if (!fname.empty()) {
                    auto asrc = [brk, &fname](const std::string& ept) {
                        brk->addSourceFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "endpoints", asrc);
                    addTargets(filt, "source_endpoints", asrc);
                    addTargets(filt, "sourceEndpoints", asrc);
                    auto adst = [brk, &fname](const std::string& ept) {
                        brk->addDestinationFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "dest_endpoints", adst);
                    addTargets(filt, "destEndpoints", adst);
                }
            }
        }
    }
    auto globals = toml::find_or(doc, "globals", uVal);
    if (!globals.is_empty()) {
        if (globals.is_array()) {
            for (auto& val : globals.as_array()) {
                brk->setGlobal(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : globals.as_table()) {
                brk->setGlobal(val.first, val.second.as_string());
            }
        }
    }
    auto aliases = toml::find_or(doc, "aliases", uVal);
    if (!aliases.is_empty()) {
        if (aliases.is_array()) {
            for (auto& val : aliases.as_array()) {
                brk->addAlias(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : aliases.as_table()) {
                brk->addAlias(val.first, val.second.as_string());
            }
        }
    }
}